

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

QFileSystemEntry * QFileSystemEngine::currentPath(void)

{
  qsizetype qVar1;
  QArrayData *data;
  qsizetype qVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  char *pcVar5;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  char currentName [4097];
  QByteArray local_1080;
  QFileSystemEntry local_1068;
  char local_1028 [4104];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->m_lastSeparator = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_nativeFilePath).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_nativeFilePath).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_filePath).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_nativeFilePath).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_filePath).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_filePath).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry(in_RDI);
  memset(local_1028,0xaa,0x1001);
  pcVar5 = getcwd(local_1028,0x1000);
  if (pcVar5 != (char *)0x0) {
    QByteArray::QByteArray(&local_1080,local_1028,-1);
    QFileSystemEntry::QFileSystemEntry(&local_1068,&local_1080);
    pQVar3 = &((in_RDI->m_filePath).d.d)->super_QArrayData;
    pcVar4 = (in_RDI->m_filePath).d.ptr;
    (in_RDI->m_filePath).d.d = local_1068.m_filePath.d.d;
    (in_RDI->m_filePath).d.ptr = local_1068.m_filePath.d.ptr;
    qVar1 = (in_RDI->m_filePath).d.size;
    (in_RDI->m_filePath).d.size = local_1068.m_filePath.d.size;
    data = &((in_RDI->m_nativeFilePath).d.d)->super_QArrayData;
    pcVar5 = (in_RDI->m_nativeFilePath).d.ptr;
    (in_RDI->m_nativeFilePath).d.d = local_1068.m_nativeFilePath.d.d;
    (in_RDI->m_nativeFilePath).d.ptr = local_1068.m_nativeFilePath.d.ptr;
    qVar2 = (in_RDI->m_nativeFilePath).d.size;
    (in_RDI->m_nativeFilePath).d.size = local_1068.m_nativeFilePath.d.size;
    in_RDI->m_lastDotInFileName = local_1068.m_lastDotInFileName;
    in_RDI->m_lastSeparator = local_1068.m_lastSeparator;
    in_RDI->m_firstDotInFileName = local_1068.m_firstDotInFileName;
    local_1068.m_filePath.d.d = (Data *)pQVar3;
    local_1068.m_filePath.d.ptr = pcVar4;
    local_1068.m_filePath.d.size = qVar1;
    local_1068.m_nativeFilePath.d.d = (Data *)data;
    local_1068.m_nativeFilePath.d.ptr = pcVar5;
    local_1068.m_nativeFilePath.d.size = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
    if (&(local_1068.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1068.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1068.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_1068.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_1068.m_filePath.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1080.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1080.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::currentPath()
{
    QFileSystemEntry result;
#if defined(__GLIBC__) && !defined(PATH_MAX)
    char *currentName = ::get_current_dir_name();
    if (currentName) {
        result = QFileSystemEntry(QByteArray(currentName), QFileSystemEntry::FromNativePath());
        ::free(currentName);
    }
#else
    char currentName[PATH_MAX+1];
    if (::getcwd(currentName, PATH_MAX)) {
#if defined(Q_OS_VXWORKS) && defined(VXWORKS_VXSIM)
        QByteArray dir(currentName);
        if (dir.indexOf(':') < dir.indexOf('/'))
            dir.remove(0, dir.indexOf(':')+1);

        qstrncpy(currentName, dir.constData(), PATH_MAX);
#endif
        result = QFileSystemEntry(QByteArray(currentName), QFileSystemEntry::FromNativePath());
    }
# if defined(QT_DEBUG)
    if (result.isEmpty())
        qWarning("QFileSystemEngine::currentPath: getcwd() failed");
# endif
#endif
    return result;
}